

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMove5<(moira::Instr)71,(moira::Mode)9,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  StrWriter *this_00;
  long lVar5;
  Ea<(moira::Mode)5,_(moira::Size)2> dst;
  Ea<(moira::Mode)9,_(moira::Size)2> src;
  Ea<(moira::Mode)5,_(moira::Size)2> local_48;
  Ea<(moira::Mode)9,_(moira::Size)2> local_34;
  
  local_34.reg = op & 7;
  local_34.pc = *addr;
  *addr = local_34.pc + 2;
  local_34.ext1 = (*this->_vptr_Moira[5])();
  local_34.ext1 = local_34.ext1 & 0xffff;
  local_48.reg = op >> 9 & 7;
  local_48.pc = *addr;
  *addr = local_48.pc + 2;
  local_48.ext1 = (*this->_vptr_Moira[5])(this);
  local_48.ext1 = local_48.ext1 & 0xffff;
  pcVar4 = "move";
  if (str->upper != false) {
    pcVar4 = "MOVE";
  }
  cVar3 = *pcVar4;
  while (cVar3 != '\0') {
    pcVar4 = pcVar4 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar3;
    cVar3 = *pcVar4;
  }
  if (str->upper == false) {
    cVar3 = '.';
    lVar5 = 0;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar3;
      cVar3 = ".w"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  else {
    cVar3 = '.';
    lVar5 = 0;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar3;
      cVar3 = ".W"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  iVar1 = (this->tab).raw;
  while (pcVar4 = str->ptr, pcVar4 < str->base + iVar1) {
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  this_00 = StrWriter::operator<<(str,&local_34);
  cVar3 = ',';
  lVar5 = 0;
  do {
    pcVar4 = this_00->ptr;
    this_00->ptr = pcVar4 + 1;
    *pcVar4 = cVar3;
    cVar3 = "), "[lVar5 + 2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 2);
  StrWriter::operator<<(this_00,&local_48);
  return;
}

Assistant:

void
Moira::dasmMove5(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_DI,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}